

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_da1a9::readFile
               (int channelCount,bool bulkRead,bool relativeCoords,bool randomChannels,
               string *filename)

{
  LineOrder LVar1;
  Compression CVar2;
  uint uVar3;
  bool bVar4;
  __type _Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  float *pfVar11;
  V2f *this;
  V2f *v;
  LineOrder *pLVar12;
  Compression *pCVar13;
  TileDescription *this_00;
  TileDescription *other;
  uint *puVar14;
  reference pvVar15;
  Array2D<void_*> *pAVar16;
  Array2D<unsigned_int> *pAVar17;
  size_type sVar18;
  void *pvVar19;
  void **ppvVar20;
  DeepTiledInputFile *pDVar21;
  void *pvVar22;
  byte in_CL;
  uint ly_00;
  byte in_DL;
  byte in_SIL;
  int in_EDI;
  uint dy;
  float fVar23;
  float fVar24;
  int f_4;
  int k_5;
  int j_4;
  int i_7;
  float *value_2;
  half *value_1;
  uint *value;
  uint l;
  int k_4;
  int j_3;
  int i_6;
  int f_3;
  size_t k_3;
  int tx_1;
  int ty_1;
  int dwx_3;
  int dwy_3;
  int x_3;
  int y_3;
  int f_2;
  size_t k_2;
  int tx;
  int ty;
  int dwx_2;
  int dwy_2;
  int x_2;
  int y_2;
  Box2i box_2;
  int j_2;
  int i_5;
  int f_1;
  size_t k_1;
  int dwx_1;
  int dwy_1;
  int x_1;
  int y_1;
  Box2i box_1;
  int j_1;
  int i_4;
  int f;
  size_t k;
  int dwx;
  int dwy;
  int x;
  int y;
  Box2i box;
  int j;
  int i_3;
  Box2i dataWindowL;
  int lx;
  int ly;
  string str_1;
  stringstream ss_1;
  int in_stack_000005a4;
  int in_stack_000005a8;
  int in_stack_000005ac;
  int in_stack_000005b0;
  int in_stack_000005b4;
  DeepTiledInputFile *in_stack_000005b8;
  int in_stack_000005d0;
  int pointerSize_1;
  int sampleSize_1;
  PixelType type_1;
  int i_2;
  int pointerSize;
  int sampleSize;
  string str;
  stringstream ss;
  PixelType type;
  int i_1;
  int channels_added;
  vector<int,_std::allocator<int>_> read_channel;
  int memOffset;
  DeepFrameBuffer frameBuffer;
  int i;
  Array<Imf_2_5::Array2D<void_*>_> data;
  int fillChannels;
  Array2D<unsigned_int> localSampleCount;
  Header *fileHeader;
  DeepTiledInputFile file;
  int in_stack_fffffffffffff5d4;
  undefined4 in_stack_fffffffffffff5d8;
  int in_stack_fffffffffffff5dc;
  uint in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5e8;
  DeepFrameBuffer *in_stack_fffffffffffff5f0;
  void *in_stack_fffffffffffff5f8;
  DeepTiledInputFile *in_stack_fffffffffffff600;
  size_t in_stack_fffffffffffff608;
  ChannelList *in_stack_fffffffffffff610;
  undefined4 in_stack_fffffffffffff618;
  undefined4 in_stack_fffffffffffff61c;
  undefined4 in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff624;
  long in_stack_fffffffffffff628;
  Array<Imf_2_5::Array2D<void_*>_> *in_stack_fffffffffffff630;
  undefined8 in_stack_fffffffffffff640;
  undefined8 in_stack_fffffffffffff648;
  size_type in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff790;
  uint in_stack_fffffffffffff794;
  int in_stack_fffffffffffff79c;
  int in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7a4;
  Array2D<void_*> *in_stack_fffffffffffff7a8;
  void *in_stack_fffffffffffff7c8;
  void *in_stack_fffffffffffff7d0;
  DeepTiledInputFile *in_stack_fffffffffffff7d8;
  int in_stack_fffffffffffff7f4;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  DeepTiledInputFile *in_stack_fffffffffffff800;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  uint local_61c;
  int local_618;
  int local_614;
  int local_610;
  int local_60c;
  ulong local_608;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  size_type local_5e0;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  DeepTiledInputFile *local_5a0;
  int local_58c;
  undefined4 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  int in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa84;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  ulong local_568;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  int local_528;
  int local_524;
  string local_4e8 [32];
  stringstream local_4c8 [16];
  undefined1 local_4b8 [84];
  int in_stack_fffffffffffffb9c;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  int in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  DeepTiledInputFile *in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbc0;
  int local_330;
  string local_2e8 [32];
  stringstream local_2c8 [16];
  undefined1 local_2b8 [376];
  undefined4 local_140;
  int local_13c;
  int local_138;
  vector<int,_std::allocator<int>_> local_130;
  Slice local_118;
  int local_dc;
  int local_6c;
  Array local_68 [20];
  int local_54;
  Array2D<unsigned_int> local_50;
  Header *local_28;
  DeepTiledInputFile local_20;
  byte local_7;
  byte local_6;
  byte local_5;
  int local_4;
  
  local_5 = in_SIL & 1;
  local_6 = in_DL & 1;
  local_7 = in_CL & 1;
  if ((local_6 != 0) && (local_5 != 0)) {
    __assert_fail("bulkRead == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1a3,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  local_4 = in_EDI;
  poVar10 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar10,std::flush<char,std::char_traits<char>>);
  std::__cxx11::string::c_str();
  Imf_2_5::DeepTiledInputFile::DeepTiledInputFile
            (in_stack_fffffffffffff800,
             (char *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
             in_stack_fffffffffffff7f4);
  local_28 = Imf_2_5::DeepTiledInputFile::header(&local_20);
  Imf_2_5::Header::displayWindow((Header *)0x17cd88);
  Imf_2_5::Header::displayWindow((Header *)0x17cd9e);
  bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                     (Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
  if (!bVar4) {
    __assert_fail("fileHeader.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1aa,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  Imf_2_5::Header::dataWindow((Header *)0x17ce1a);
  Imf_2_5::Header::dataWindow((Header *)0x17ce30);
  bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                     (Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
  if (!bVar4) {
    __assert_fail("fileHeader.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ab,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar11 = Imf_2_5::Header::pixelAspectRatio((Header *)0x17ce93);
  fVar23 = *pfVar11;
  pfVar11 = Imf_2_5::Header::pixelAspectRatio((Header *)0x17cebe);
  if ((fVar23 != *pfVar11) || (NAN(fVar23) || NAN(*pfVar11))) {
    __assert_fail("fileHeader.pixelAspectRatio() == header.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ac,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this = Imf_2_5::Header::screenWindowCenter((Header *)0x17cf0e);
  v = Imf_2_5::Header::screenWindowCenter((Header *)0x17cf24);
  bVar4 = Imath_2_5::Vec2<float>::operator==(this,v);
  if (!bVar4) {
    __assert_fail("fileHeader.screenWindowCenter() == header.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ad,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar11 = Imf_2_5::Header::screenWindowWidth((Header *)0x17cf87);
  fVar23 = *pfVar11;
  pfVar11 = Imf_2_5::Header::screenWindowWidth((Header *)0x17cfb2);
  if ((fVar23 == *pfVar11) && (!NAN(fVar23) && !NAN(*pfVar11))) {
    pLVar12 = Imf_2_5::Header::lineOrder((Header *)0x17d002);
    LVar1 = *pLVar12;
    pLVar12 = Imf_2_5::Header::lineOrder((Header *)0x17d029);
    if (LVar1 != *pLVar12) {
      __assert_fail("fileHeader.lineOrder() == header.lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                    ,0x1af,
                    "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                   );
    }
    pCVar13 = Imf_2_5::Header::compression((Header *)0x17d074);
    CVar2 = *pCVar13;
    pCVar13 = Imf_2_5::Header::compression((Header *)0x17d09b);
    if (CVar2 != *pCVar13) {
      __assert_fail("fileHeader.compression() == header.compression()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                    ,0x1b0,
                    "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                   );
    }
    Imf_2_5::Header::channels((Header *)0x17d0e6);
    Imf_2_5::Header::channels((Header *)0x17d0fc);
    bVar4 = Imf_2_5::ChannelList::operator==
                      ((ChannelList *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                       in_stack_fffffffffffff610);
    if (!bVar4) {
      __assert_fail("fileHeader.channels() == header.channels()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                    ,0x1b1,
                    "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                   );
    }
    Imf_2_5::Header::type_abi_cxx11_((Header *)0x17d15f);
    Imf_2_5::Header::type_abi_cxx11_((Header *)0x17d175);
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
    if (!_Var5) {
      __assert_fail("fileHeader.type() == header.type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                    ,0x1b2,
                    "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                   );
    }
    this_00 = Imf_2_5::Header::tileDescription((Header *)0x17d1c8);
    other = Imf_2_5::Header::tileDescription((Header *)0x17d1de);
    bVar4 = Imf_2_5::TileDescription::operator==(this_00,other);
    if (!bVar4) {
      __assert_fail("fileHeader.tileDescription() == header.tileDescription()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                    ,0x1b3,
                    "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                   );
    }
    Imf_2_5::Array2D<unsigned_int>::Array2D(&local_50);
    Imf_2_5::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)in_stack_fffffffffffff5f0,(long)in_stack_fffffffffffff5e8,
               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0));
    local_54 = random_int(in_stack_fffffffffffff5d4);
    Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array
              (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
    local_58c = in_stack_fffffffffffffa7c;
    for (local_6c = 0; local_6c < local_4 + local_54; local_6c = local_6c + 1) {
      Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
      Imf_2_5::Array2D<void_*>::resizeErase
                ((Array2D<void_*> *)in_stack_fffffffffffff5f0,(long)in_stack_fffffffffffff5e8,
                 CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0));
    }
    Imf_2_5::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffff5f0);
    if ((local_6 & 1) == 0) {
      local_dc = (anonymous_namespace)::dataWindow + DAT_00564efc * 0x111;
    }
    else {
      local_dc = 0;
    }
    puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,0);
    ly_00 = local_6 & 1;
    dy = ly_00;
    Imf_2_5::Slice::Slice
              (&local_118,UINT,(char *)(puVar14 + -(long)local_dc),4,0x444,1,1,0.0,SUB41(ly_00,0),
               SUB41(ly_00,0));
    Imf_2_5::DeepFrameBuffer::insertSampleCountSlice
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               (Slice *)CONCAT44(in_stack_fffffffffffff5dc,dy));
    std::allocator<int>::allocator((allocator<int> *)0x17d421);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5f0,
               (size_type)in_stack_fffffffffffff5e8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0));
    std::allocator<int>::~allocator((allocator<int> *)0x17d44d);
    local_138 = 0;
    for (local_13c = 0; local_13c < local_4; local_13c = local_13c + 1) {
      if ((local_7 & 1) != 0) {
        iVar6 = random_int(in_stack_fffffffffffff5d4);
        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[](&local_130,(long)local_13c);
        *pvVar15 = iVar6;
      }
      if (((local_7 & 1) == 0) ||
         (pvVar15 = std::vector<int,_std::allocator<int>_>::operator[](&local_130,(long)local_13c),
         *pvVar15 == 1)) {
        local_140 = 3;
        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             (anonymous_namespace)::channelTypes,(long)local_13c);
        if (*pvVar15 == 0) {
          local_140 = 0;
        }
        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             (anonymous_namespace)::channelTypes,(long)local_13c);
        if (*pvVar15 == 1) {
          local_140 = 1;
        }
        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             (anonymous_namespace)::channelTypes,(long)local_13c);
        if (*pvVar15 == 2) {
          local_140 = 2;
        }
        std::__cxx11::stringstream::stringstream(local_2c8);
        std::ostream::operator<<(local_2b8,local_13c);
        std::__cxx11::stringstream::str();
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                   (long)local_13c);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                   (long)local_13c);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                   (long)local_13c);
        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
        Imf_2_5::Array2D<void_*>::operator[](pAVar16 + local_13c,0);
        dy = local_6 & 1;
        ly_00 = 1;
        in_stack_fffffffffffff5e0 = dy;
        Imf_2_5::DeepSlice::DeepSlice
                  ((DeepSlice *)in_stack_fffffffffffff630,
                   (PixelType)((ulong)in_stack_fffffffffffff628 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                   CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                   (size_t)in_stack_fffffffffffff610,in_stack_fffffffffffff608,
                   (int)in_stack_fffffffffffff640,(int)in_stack_fffffffffffff648,
                   (double)in_stack_fffffffffffff600,
                   SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x30,0));
        Imf_2_5::DeepFrameBuffer::insert
                  ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (string *)CONCAT44(in_stack_fffffffffffff5dc,dy),
                   (DeepSlice *)CONCAT44(in_stack_fffffffffffff5d4,ly_00));
        local_138 = local_138 + 1;
        std::__cxx11::string::~string(local_2e8);
        std::__cxx11::stringstream::~stringstream(local_2c8);
      }
    }
    if (local_138 == 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,"skipping ");
      std::ostream::operator<<(poVar10,std::flush<char,std::char_traits<char>>);
    }
    else {
      for (local_330 = 0; local_330 < local_54; local_330 = local_330 + 1) {
        std::__cxx11::stringstream::stringstream(local_4c8);
        poVar10 = (ostream *)std::ostream::operator<<(local_4b8,local_330);
        std::operator<<(poVar10,"fill");
        std::__cxx11::stringstream::str();
        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
        Imf_2_5::Array2D<void_*>::operator[](pAVar16 + (local_330 + local_4),0);
        dy = local_6 & 1;
        ly_00 = 1;
        in_stack_fffffffffffff5e0 = dy;
        Imf_2_5::DeepSlice::DeepSlice
                  ((DeepSlice *)in_stack_fffffffffffff630,
                   (PixelType)((ulong)in_stack_fffffffffffff628 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                   CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),
                   (size_t)in_stack_fffffffffffff610,in_stack_fffffffffffff608,
                   (int)in_stack_fffffffffffff640,(int)in_stack_fffffffffffff648,
                   (double)in_stack_fffffffffffff600,
                   SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x30,0));
        Imf_2_5::DeepFrameBuffer::insert
                  ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                   (string *)CONCAT44(in_stack_fffffffffffff5dc,dy),
                   (DeepSlice *)CONCAT44(in_stack_fffffffffffff5d4,ly_00));
        std::__cxx11::string::~string(local_4e8);
        std::__cxx11::stringstream::~stringstream(local_4c8);
      }
      Imf_2_5::DeepTiledInputFile::setFrameBuffer
                ((DeepTiledInputFile *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80)
                 ,(DeepFrameBuffer *)CONCAT44(local_58c,in_stack_fffffffffffffa78));
      if ((local_5 & 1) == 0) {
        if ((local_6 & 1) == 0) {
          poVar10 = std::operator<<((ostream *)&std::cout,"per-tile ");
          std::ostream::operator<<(poVar10,std::flush<char,std::char_traits<char>>);
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cout,"per-tile with relative coordinates ");
          std::ostream::operator<<(poVar10,std::flush<char,std::char_traits<char>>);
        }
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cout,"bulk ");
        std::ostream::operator<<(poVar10,std::flush<char,std::char_traits<char>>);
      }
      for (local_524 = 0; iVar6 = Imf_2_5::DeepTiledInputFile::numYLevels(&local_20),
          local_524 < iVar6; local_524 = local_524 + 1) {
        for (local_528 = 0; iVar6 = Imf_2_5::DeepTiledInputFile::numXLevels(&local_20),
            local_528 < iVar6; local_528 = local_528 + 1) {
          Imf_2_5::DeepTiledInputFile::dataWindowForLevel
                    ((DeepTiledInputFile *)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4,
                     in_stack_fffffffffffff7a0);
          if ((local_5 & 1) == 0) {
            if ((local_5 & 1) == 0) {
              if ((local_6 & 1) == 0) {
                for (local_570 = 0;
                    iVar6 = Imf_2_5::DeepTiledInputFile::numYTiles
                                      ((DeepTiledInputFile *)
                                       CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790)
                                       ,(int)(in_stack_fffffffffffff788 >> 0x20)), local_570 < iVar6
                    ; local_570 = local_570 + 1) {
                  for (local_574 = 0;
                      iVar6 = Imf_2_5::DeepTiledInputFile::numXTiles
                                        ((DeepTiledInputFile *)
                                         CONCAT44(in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790),
                                         (int)(in_stack_fffffffffffff788 >> 0x20)),
                      local_574 < iVar6; local_574 = local_574 + 1) {
                    Imf_2_5::DeepTiledInputFile::readPixelSampleCount
                              ((DeepTiledInputFile *)
                               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                               in_stack_fffffffffffff5dc,dy,in_stack_fffffffffffff5d4,ly_00);
                    Imf_2_5::DeepTiledInputFile::dataWindowForTile
                              (in_stack_fffffffffffff7d8,
                               (int)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
                               (int)in_stack_fffffffffffff7d0,
                               (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
                               (int)in_stack_fffffffffffff7c8);
                    iVar6 = in_stack_fffffffffffffa80;
                    for (; iVar7 = local_58c, in_stack_fffffffffffffa80 <= local_578;
                        in_stack_fffffffffffffa80 = in_stack_fffffffffffffa80 + 1) {
                      for (; local_58c <= in_stack_fffffffffffffa84; local_58c = local_58c + 1) {
                        iVar8 = in_stack_fffffffffffffa80 - local_534;
                        iVar9 = local_58c - local_538;
                        puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)iVar8);
                        uVar3 = puVar14[iVar9];
                        pAVar17 = Imf_2_5::Array2D<Imf_2_5::Array2D<unsigned_int>_>::operator[]
                                            ((Array2D<Imf_2_5::Array2D<unsigned_int>_> *)
                                             (anonymous_namespace)::sampleCountWhole,(long)local_524
                                            );
                        puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                            (pAVar17 + local_528,(long)iVar8);
                        if (uVar3 != puVar14[iVar9]) {
                          __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                        ,0x264,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        local_5a0 = (DeepTiledInputFile *)0x0;
                        while (in_stack_fffffffffffff7d8 = local_5a0,
                              pDVar21 = (DeepTiledInputFile *)
                                        std::vector<int,_std::allocator<int>_>::size
                                                  ((vector<int,_std::allocator<int>_> *)
                                                   (anonymous_namespace)::channelTypes),
                              in_stack_fffffffffffff7d8 < pDVar21) {
                          pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                              ((vector<int,_std::allocator<int>_> *)
                                               (anonymous_namespace)::channelTypes,
                                               (size_type)local_5a0);
                          if (*pvVar15 == 0) {
                            puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                                (&local_50,(long)iVar8);
                            in_stack_fffffffffffff7d0 = operator_new__((ulong)puVar14[iVar9] << 2);
                            pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                            ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                                 (pAVar16 + (long)local_5a0,(long)iVar8);
                            ppvVar20[iVar9] = in_stack_fffffffffffff7d0;
                          }
                          pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                              ((vector<int,_std::allocator<int>_> *)
                                               (anonymous_namespace)::channelTypes,
                                               (size_type)local_5a0);
                          if (*pvVar15 == 1) {
                            puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                                (&local_50,(long)iVar8);
                            in_stack_fffffffffffff7c8 = operator_new__((ulong)puVar14[iVar9] * 2);
                            pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                            ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                                 (pAVar16 + (long)local_5a0,(long)iVar8);
                            ppvVar20[iVar9] = in_stack_fffffffffffff7c8;
                          }
                          pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                              ((vector<int,_std::allocator<int>_> *)
                                               (anonymous_namespace)::channelTypes,
                                               (size_type)local_5a0);
                          if (*pvVar15 == 2) {
                            puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                                (&local_50,(long)iVar8);
                            pvVar19 = operator_new__((ulong)puVar14[iVar9] << 2);
                            pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                            ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                                 (pAVar16 + (long)local_5a0,(long)iVar8);
                            ppvVar20[iVar9] = pvVar19;
                          }
                          local_5a0 = (DeepTiledInputFile *)
                                      ((long)&(local_5a0->super_GenericInputFile).
                                              _vptr_GenericInputFile + 1);
                        }
                        for (local_5a4 = 0; local_5a4 < local_54; local_5a4 = local_5a4 + 1) {
                          puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                              (&local_50,(long)iVar8);
                          pvVar19 = operator_new__((ulong)puVar14[iVar9] << 2);
                          in_stack_fffffffffffff7a8 =
                               Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                          sVar18 = std::vector<int,_std::allocator<int>_>::size
                                             ((vector<int,_std::allocator<int>_> *)
                                              (anonymous_namespace)::channelTypes);
                          ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                               (in_stack_fffffffffffff7a8 + (long)local_5a4 + sVar18
                                                ,(long)iVar8);
                          ppvVar20[iVar9] = pvVar19;
                        }
                      }
                      local_58c = iVar7;
                    }
                    Imf_2_5::DeepTiledInputFile::readTile
                              ((DeepTiledInputFile *)
                               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                               in_stack_fffffffffffff5dc,dy,in_stack_fffffffffffff5d4,ly_00);
                    in_stack_fffffffffffffa80 = iVar6;
                  }
                }
              }
              else if ((local_6 & 1) != 0) {
                local_5a8 = 0;
                while (in_stack_fffffffffffff7a0 = local_5a8,
                      in_stack_fffffffffffff7a4 =
                           Imf_2_5::DeepTiledInputFile::numYTiles
                                     ((DeepTiledInputFile *)
                                      CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                                      (int)(in_stack_fffffffffffff788 >> 0x20)),
                      in_stack_fffffffffffff7a0 < in_stack_fffffffffffff7a4) {
                  for (local_5ac = 0;
                      in_stack_fffffffffffff79c =
                           Imf_2_5::DeepTiledInputFile::numXTiles
                                     ((DeepTiledInputFile *)
                                      CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                                      (int)(in_stack_fffffffffffff788 >> 0x20)),
                      local_5ac < in_stack_fffffffffffff79c; local_5ac = local_5ac + 1) {
                    Imf_2_5::DeepTiledInputFile::readPixelSampleCount
                              ((DeepTiledInputFile *)
                               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                               in_stack_fffffffffffff5dc,dy,in_stack_fffffffffffff5d4,ly_00);
                    Imf_2_5::DeepTiledInputFile::dataWindowForTile
                              (in_stack_fffffffffffff7d8,
                               (int)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
                               (int)in_stack_fffffffffffff7d0,
                               (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
                               (int)in_stack_fffffffffffff7c8);
                    for (local_5c0 = local_5b8; local_5c0 <= local_5b0; local_5c0 = local_5c0 + 1) {
                      for (local_5c4 = local_5bc; local_5c4 <= local_5b4; local_5c4 = local_5c4 + 1)
                      {
                        iVar6 = local_5c0 - local_5b8;
                        iVar7 = local_5c4 - local_5bc;
                        puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)iVar6);
                        in_stack_fffffffffffff794 = puVar14[iVar7];
                        pAVar17 = Imf_2_5::Array2D<Imf_2_5::Array2D<unsigned_int>_>::operator[]
                                            ((Array2D<Imf_2_5::Array2D<unsigned_int>_> *)
                                             (anonymous_namespace)::sampleCountWhole,(long)local_524
                                            );
                        puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                            (pAVar17 + local_528,(long)(local_5c0 - local_534));
                        if (in_stack_fffffffffffff794 != puVar14[local_5c4 - local_538]) {
                          __assert_fail("localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                        ,0x28d,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        local_5e0 = 0;
                        while (in_stack_fffffffffffff788 = local_5e0,
                              sVar18 = std::vector<int,_std::allocator<int>_>::size
                                                 ((vector<int,_std::allocator<int>_> *)
                                                  (anonymous_namespace)::channelTypes),
                              in_stack_fffffffffffff788 < sVar18) {
                          if (((local_7 & 1) == 0) ||
                             (pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  (&local_130,local_5e0), *pvVar15 == 1)) {
                            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                                ((vector<int,_std::allocator<int>_> *)
                                                 (anonymous_namespace)::channelTypes,local_5e0);
                            if (*pvVar15 == 0) {
                              puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                                  (&local_50,(long)iVar6);
                              pvVar19 = operator_new__((ulong)puVar14[iVar7] << 2);
                              pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                              ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                                   (pAVar16 + local_5e0,(long)iVar6);
                              ppvVar20[iVar7] = pvVar19;
                            }
                            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                                ((vector<int,_std::allocator<int>_> *)
                                                 (anonymous_namespace)::channelTypes,local_5e0);
                            if (*pvVar15 == 1) {
                              puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                                  (&local_50,(long)iVar6);
                              pvVar19 = operator_new__((ulong)puVar14[iVar7] * 2);
                              pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                              ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                                   (pAVar16 + local_5e0,(long)iVar6);
                              ppvVar20[iVar7] = pvVar19;
                            }
                            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                                ((vector<int,_std::allocator<int>_> *)
                                                 (anonymous_namespace)::channelTypes,local_5e0);
                            if (*pvVar15 == 2) {
                              puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                                  (&local_50,(long)iVar6);
                              pvVar19 = operator_new__((ulong)puVar14[iVar7] << 2);
                              pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                              ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                                   (pAVar16 + local_5e0,(long)iVar6);
                              ppvVar20[iVar7] = pvVar19;
                            }
                          }
                          local_5e0 = local_5e0 + 1;
                        }
                        for (local_5e4 = 0; local_5e4 < local_54; local_5e4 = local_5e4 + 1) {
                          puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                              (&local_50,(long)iVar6);
                          pvVar19 = operator_new__((ulong)puVar14[iVar7] << 2);
                          pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                          sVar18 = std::vector<int,_std::allocator<int>_>::size
                                             ((vector<int,_std::allocator<int>_> *)
                                              (anonymous_namespace)::channelTypes);
                          ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                               (pAVar16 + (long)local_5e4 + sVar18,(long)iVar6);
                          ppvVar20[iVar7] = pvVar19;
                        }
                      }
                    }
                    Imf_2_5::DeepTiledInputFile::readTile
                              ((DeepTiledInputFile *)
                               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                               in_stack_fffffffffffff5dc,dy,in_stack_fffffffffffff5d4,ly_00);
                    for (local_5e8 = local_5b8; local_5e8 <= local_5b0; local_5e8 = local_5e8 + 1) {
                      for (local_5ec = local_5bc; local_5ec <= local_5b4; local_5ec = local_5ec + 1)
                      {
                        iVar6 = local_5e8 - local_5b8;
                        iVar7 = local_5ec - local_5bc;
                        for (local_608 = 0;
                            sVar18 = std::vector<int,_std::allocator<int>_>::size
                                               ((vector<int,_std::allocator<int>_> *)
                                                (anonymous_namespace)::channelTypes),
                            local_608 < sVar18; local_608 = local_608 + 1) {
                          if (((local_7 & 1) == 0) ||
                             (pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  (&local_130,local_608), *pvVar15 == 1)) {
                            pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                            Imf_2_5::Array2D<void_*>::operator[](pAVar16 + local_608,(long)iVar6);
                            Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)iVar6);
                            std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,local_608);
                            checkValue(in_stack_fffffffffffff600,
                                       (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
                                       (int)in_stack_fffffffffffff5f8,
                                       (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20),
                                       (int)in_stack_fffffffffffff5f0);
                            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                                ((vector<int,_std::allocator<int>_> *)
                                                 (anonymous_namespace)::channelTypes,local_608);
                            if (*pvVar15 == 0) {
                              pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                              ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                                   (pAVar16 + local_608,(long)iVar6);
                              if (ppvVar20[iVar7] != (void *)0x0) {
                                operator_delete__(ppvVar20[iVar7]);
                              }
                            }
                            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                                ((vector<int,_std::allocator<int>_> *)
                                                 (anonymous_namespace)::channelTypes,local_608);
                            if (*pvVar15 == 1) {
                              pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                              ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                                   (pAVar16 + local_608,(long)iVar6);
                              if (ppvVar20[iVar7] != (void *)0x0) {
                                operator_delete__(ppvVar20[iVar7]);
                              }
                            }
                            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                                ((vector<int,_std::allocator<int>_> *)
                                                 (anonymous_namespace)::channelTypes,local_608);
                            if (*pvVar15 == 2) {
                              pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                              ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                                   (pAVar16 + local_608,(long)iVar6);
                              if (ppvVar20[iVar7] != (void *)0x0) {
                                operator_delete__(ppvVar20[iVar7]);
                              }
                            }
                          }
                        }
                        for (local_60c = 0; local_60c < local_54; local_60c = local_60c + 1) {
                          pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                          sVar18 = std::vector<int,_std::allocator<int>_>::size
                                             ((vector<int,_std::allocator<int>_> *)
                                              (anonymous_namespace)::channelTypes);
                          ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                               (pAVar16 + (long)local_60c + sVar18,(long)iVar6);
                          if (ppvVar20[iVar7] != (void *)0x0) {
                            operator_delete__(ppvVar20[iVar7]);
                          }
                        }
                      }
                    }
                  }
                  local_5a8 = local_5a8 + 1;
                }
              }
            }
          }
          else {
            Imf_2_5::DeepTiledInputFile::numXTiles
                      ((DeepTiledInputFile *)
                       CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                       (int)(in_stack_fffffffffffff788 >> 0x20));
            Imf_2_5::DeepTiledInputFile::numYTiles
                      ((DeepTiledInputFile *)
                       CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                       (int)(in_stack_fffffffffffff788 >> 0x20));
            Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
                      (in_stack_000005b8,in_stack_000005b4,in_stack_000005b0,in_stack_000005ac,
                       in_stack_000005a8,in_stack_000005a4,in_stack_000005d0);
            for (local_53c = 0;
                iVar6 = Imf_2_5::DeepTiledInputFile::numYTiles
                                  ((DeepTiledInputFile *)
                                   CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                                   (int)(in_stack_fffffffffffff788 >> 0x20)), local_53c < iVar6;
                local_53c = local_53c + 1) {
              for (local_540 = 0;
                  iVar6 = Imf_2_5::DeepTiledInputFile::numXTiles
                                    ((DeepTiledInputFile *)
                                     CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                                     (int)(in_stack_fffffffffffff788 >> 0x20)), local_540 < iVar6;
                  local_540 = local_540 + 1) {
                Imf_2_5::DeepTiledInputFile::dataWindowForTile
                          (in_stack_fffffffffffff7d8,(int)((ulong)in_stack_fffffffffffff7d0 >> 0x20)
                           ,(int)in_stack_fffffffffffff7d0,
                           (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
                           (int)in_stack_fffffffffffff7c8);
                for (local_554 = local_54c; local_554 <= local_544; local_554 = local_554 + 1) {
                  for (local_558 = local_550; local_558 <= local_548; local_558 = local_558 + 1) {
                    iVar6 = local_554 - local_534;
                    iVar7 = local_558 - local_538;
                    puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)iVar6);
                    uVar3 = puVar14[iVar7];
                    pAVar17 = Imf_2_5::Array2D<Imf_2_5::Array2D<unsigned_int>_>::operator[]
                                        ((Array2D<Imf_2_5::Array2D<unsigned_int>_> *)
                                         (anonymous_namespace)::sampleCountWhole,(long)local_524);
                    puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                        (pAVar17 + local_528,(long)iVar6);
                    if (uVar3 != puVar14[iVar7]) {
                      __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                    ,0x238,
                                    "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                   );
                    }
                    for (local_568 = 0;
                        sVar18 = std::vector<int,_std::allocator<int>_>::size
                                           ((vector<int,_std::allocator<int>_> *)
                                            (anonymous_namespace)::channelTypes), local_568 < sVar18
                        ; local_568 = local_568 + 1) {
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,local_568);
                      if (*pvVar15 == 0) {
                        puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)iVar6);
                        pvVar19 = operator_new__((ulong)puVar14[iVar7] << 2);
                        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                        ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                             (pAVar16 + local_568,(long)iVar6);
                        ppvVar20[iVar7] = pvVar19;
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,local_568);
                      if (*pvVar15 == 1) {
                        puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)iVar6);
                        pvVar19 = operator_new__((ulong)puVar14[iVar7] * 2);
                        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                        ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                             (pAVar16 + local_568,(long)iVar6);
                        ppvVar20[iVar7] = pvVar19;
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,local_568);
                      if (*pvVar15 == 2) {
                        puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)iVar6);
                        pvVar19 = operator_new__((ulong)puVar14[iVar7] << 2);
                        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                        ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                             (pAVar16 + local_568,(long)iVar6);
                        ppvVar20[iVar7] = pvVar19;
                      }
                    }
                    for (local_56c = 0; local_56c < local_54; local_56c = local_56c + 1) {
                      puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[](&local_50,(long)iVar6);
                      pvVar19 = operator_new__((ulong)puVar14[iVar7] << 2);
                      pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                      sVar18 = std::vector<int,_std::allocator<int>_>::size
                                         ((vector<int,_std::allocator<int>_> *)
                                          (anonymous_namespace)::channelTypes);
                      ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                           (pAVar16 + (long)local_56c + sVar18,(long)iVar6);
                      ppvVar20[iVar7] = pvVar19;
                    }
                  }
                }
              }
            }
            Imf_2_5::DeepTiledInputFile::numXTiles
                      ((DeepTiledInputFile *)
                       CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                       (int)(in_stack_fffffffffffff788 >> 0x20));
            Imf_2_5::DeepTiledInputFile::numYTiles
                      ((DeepTiledInputFile *)
                       CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                       (int)(in_stack_fffffffffffff788 >> 0x20));
            Imf_2_5::DeepTiledInputFile::readTiles
                      (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac,in_stack_fffffffffffffba8
                       ,in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,
                       in_stack_fffffffffffffb9c,in_stack_fffffffffffffbc0);
          }
          if ((local_6 & 1) == 0) {
            for (local_610 = 0;
                iVar6 = Imf_2_5::DeepTiledInputFile::levelHeight
                                  ((DeepTiledInputFile *)
                                   CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                                   in_stack_fffffffffffff79c), local_610 < iVar6;
                local_610 = local_610 + 1) {
              for (local_614 = 0;
                  iVar6 = Imf_2_5::DeepTiledInputFile::levelWidth
                                    ((DeepTiledInputFile *)
                                     CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                                     in_stack_fffffffffffff79c), local_614 < iVar6;
                  local_614 = local_614 + 1) {
                for (local_618 = 0; local_618 < local_4; local_618 = local_618 + 1) {
                  if (((local_7 & 1) == 0) ||
                     (pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          (&local_130,(long)local_618), *pvVar15 == 1)) {
                    for (local_61c = 0;
                        puVar14 = Imf_2_5::Array2D<unsigned_int>::operator[]
                                            (&local_50,(long)local_610),
                        local_61c < puVar14[local_614]; local_61c = local_61c + 1) {
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_618);
                      if (*pvVar15 == 0) {
                        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                        ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                             (pAVar16 + local_618,(long)local_610);
                        pvVar19 = ppvVar20[local_614];
                        if (*(uint *)((long)pvVar19 + (ulong)local_61c * 4) !=
                            (uint)(local_610 * 0x111 + local_614) % 0x801) {
                          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,local_614);
                          poVar10 = std::operator<<(poVar10,", ");
                          poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_610);
                          poVar10 = std::operator<<(poVar10," error, should be ");
                          poVar10 = (ostream *)
                                    std::ostream::operator<<
                                              (poVar10,(local_610 * 0x111 + local_614) % 0x801);
                          poVar10 = std::operator<<(poVar10,", is ");
                          pvVar22 = (void *)std::ostream::operator<<
                                                      (poVar10,*(uint *)((long)pvVar19 +
                                                                        (ulong)local_61c * 4));
                          pvVar22 = (void *)std::ostream::operator<<
                                                      (pvVar22,std::
                                                  endl<char,std::char_traits<char>>);
                          std::ostream::operator<<(pvVar22,std::flush<char,std::char_traits<char>>);
                        }
                        if (*(uint *)((long)pvVar19 + (ulong)local_61c * 4) !=
                            (uint)(local_610 * 0x111 + local_614) % 0x801) {
                          __assert_fail("value[l] == static_cast<unsigned int>(i * width + j) % 2049"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                        ,0x2d8,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_618);
                      if (*pvVar15 == 1) {
                        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                        ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                             (pAVar16 + local_618,(long)local_610);
                        pvVar19 = ppvVar20[local_614];
                        fVar23 = half::operator_cast_to_float
                                           ((half *)((long)pvVar19 + (ulong)local_61c * 2));
                        fVar24 = (float)((local_610 * 0x111 + local_614) % 0x801);
                        if ((fVar23 != fVar24) || (NAN(fVar23) || NAN(fVar24))) {
                          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,local_614);
                          poVar10 = std::operator<<(poVar10,", ");
                          poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_610);
                          poVar10 = std::operator<<(poVar10," error, should be ");
                          poVar10 = (ostream *)
                                    std::ostream::operator<<
                                              (poVar10,(local_610 * 0x111 + local_614) % 0x801);
                          poVar10 = std::operator<<(poVar10,", is ");
                          pvVar19 = (void *)::operator<<(poVar10,(half)*(unsigned_short *)
                                                                        ((long)pvVar19 +
                                                                        (ulong)local_61c * 2));
                          pvVar19 = (void *)std::ostream::operator<<
                                                      (pvVar19,std::
                                                  endl<char,std::char_traits<char>>);
                          std::ostream::operator<<(pvVar19,std::flush<char,std::char_traits<char>>);
                        }
                        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                        ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                             (pAVar16 + local_618,(long)local_610);
                        fVar23 = half::operator_cast_to_float
                                           ((half *)((long)ppvVar20[local_614] +
                                                    (ulong)local_61c * 2));
                        fVar24 = (float)((local_610 * 0x111 + local_614) % 0x801);
                        if ((fVar23 != fVar24) || (NAN(fVar23) || NAN(fVar24))) {
                          __assert_fail("((half*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                        ,0x2e1,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                      }
                      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)
                                           (anonymous_namespace)::channelTypes,(long)local_618);
                      if (*pvVar15 == 2) {
                        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                        ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                             (pAVar16 + local_618,(long)local_610);
                        pvVar19 = ppvVar20[local_614];
                        fVar23 = *(float *)((long)pvVar19 + (ulong)local_61c * 4);
                        fVar24 = (float)((local_610 * 0x111 + local_614) % 0x801);
                        if ((fVar23 != fVar24) || (NAN(fVar23) || NAN(fVar24))) {
                          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,local_614);
                          poVar10 = std::operator<<(poVar10,", ");
                          poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_610);
                          poVar10 = std::operator<<(poVar10," error, should be ");
                          poVar10 = (ostream *)
                                    std::ostream::operator<<
                                              (poVar10,(local_610 * 0x111 + local_614) % 0x801);
                          poVar10 = std::operator<<(poVar10,", is ");
                          pvVar19 = (void *)std::ostream::operator<<
                                                      (poVar10,*(float *)((long)pvVar19 +
                                                                         (ulong)local_61c * 4));
                          pvVar19 = (void *)std::ostream::operator<<
                                                      (pvVar19,std::
                                                  endl<char,std::char_traits<char>>);
                          std::ostream::operator<<(pvVar19,std::flush<char,std::char_traits<char>>);
                        }
                        pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                        ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                             (pAVar16 + local_618,(long)local_610);
                        fVar23 = *(float *)((long)ppvVar20[local_614] + (ulong)local_61c * 4);
                        fVar24 = (float)((local_610 * 0x111 + local_614) % 0x801);
                        if ((fVar23 != fVar24) || (NAN(fVar23) || NAN(fVar24))) {
                          __assert_fail("((float*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                        ,0x2ea,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                      }
                    }
                  }
                }
              }
            }
            local_644 = 0;
            while (iVar6 = local_644,
                  iVar7 = Imf_2_5::DeepTiledInputFile::levelHeight
                                    ((DeepTiledInputFile *)
                                     CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                                     in_stack_fffffffffffff79c), iVar6 < iVar7) {
              local_648 = 0;
              while (iVar6 = local_648,
                    iVar7 = Imf_2_5::DeepTiledInputFile::levelWidth
                                      ((DeepTiledInputFile *)
                                       CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0)
                                       ,in_stack_fffffffffffff79c), iVar6 < iVar7) {
                for (local_64c = 0; local_64c < local_4; local_64c = local_64c + 1) {
                  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_64c);
                  if (*pvVar15 == 0) {
                    pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                    ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                         (pAVar16 + local_64c,(long)local_644);
                    if (ppvVar20[local_648] != (void *)0x0) {
                      operator_delete__(ppvVar20[local_648]);
                    }
                  }
                  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_64c);
                  if (*pvVar15 == 1) {
                    pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                    ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                         (pAVar16 + local_64c,(long)local_644);
                    if (ppvVar20[local_648] != (void *)0x0) {
                      operator_delete__(ppvVar20[local_648]);
                    }
                  }
                  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_64c);
                  if (*pvVar15 == 2) {
                    pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                    ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                         (pAVar16 + local_64c,(long)local_644);
                    in_stack_fffffffffffff600 = (DeepTiledInputFile *)ppvVar20[local_648];
                    if (in_stack_fffffffffffff600 != (DeepTiledInputFile *)0x0) {
                      operator_delete__(in_stack_fffffffffffff600);
                    }
                  }
                }
                for (local_650 = 0; local_650 < local_54; local_650 = local_650 + 1) {
                  pAVar16 = Imf_2_5::Array::operator_cast_to_Array2D_(local_68);
                  in_stack_fffffffffffff5f0 = (DeepFrameBuffer *)(long)local_650;
                  sVar18 = std::vector<int,_std::allocator<int>_>::size
                                     ((vector<int,_std::allocator<int>_> *)
                                      (anonymous_namespace)::channelTypes);
                  ppvVar20 = Imf_2_5::Array2D<void_*>::operator[]
                                       (pAVar16 + (long)(&(in_stack_fffffffffffff5f0->_map)._M_t.
                                                          _M_impl.field_0x0 + sVar18),
                                        (long)local_644);
                  in_stack_fffffffffffff5f8 = ppvVar20[local_648];
                  if (in_stack_fffffffffffff5f8 != (void *)0x0) {
                    operator_delete__(in_stack_fffffffffffff5f8);
                  }
                }
                local_648 = local_648 + 1;
              }
              local_644 = local_644 + 1;
            }
          }
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0));
    Imf_2_5::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x17fc93);
    Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array
              ((Array<Imf_2_5::Array2D<void_*>_> *)in_stack_fffffffffffff5f0);
    Imf_2_5::Array2D<unsigned_int>::~Array2D
              ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff5d4,ly_00));
    Imf_2_5::DeepTiledInputFile::~DeepTiledInputFile(in_stack_fffffffffffff600);
    return;
  }
  __assert_fail("fileHeader.screenWindowWidth() == header.screenWindowWidth()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                ,0x1ae,
                "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)");
}

Assistant:

void readFile (int channelCount,
               bool bulkRead,
               bool relativeCoords,
               bool randomChannels,
               const std::string & filename)
{
    if (relativeCoords)
        assert(bulkRead == false);

    cout << "reading " << flush;

    DeepTiledInputFile file (filename.c_str(), 4);

    const Header& fileHeader = file.header();
    assert (fileHeader.displayWindow() == header.displayWindow());
    assert (fileHeader.dataWindow() == header.dataWindow());
    assert (fileHeader.pixelAspectRatio() == header.pixelAspectRatio());
    assert (fileHeader.screenWindowCenter() == header.screenWindowCenter());
    assert (fileHeader.screenWindowWidth() == header.screenWindowWidth());
    assert (fileHeader.lineOrder() == header.lineOrder());
    assert (fileHeader.compression() == header.compression());
    assert (fileHeader.channels() == header.channels());
    assert (fileHeader.type() == header.type());
    assert (fileHeader.tileDescription() == header.tileDescription());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase(height, width);
    
    // also test filling channels. Generate up to 2 extra channels
    int fillChannels=random_int(3);
    
    Array<Array2D< void* > > data(channelCount+fillChannels);
    for (int i = 0; i < channelCount+fillChannels; i++)
        data[i].resizeErase(height, width);

    DeepFrameBuffer frameBuffer;

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;
    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                        (char *) (&localSampleCount[0][0] - memOffset),
                                        sizeof (unsigned int) * 1,
                                        sizeof (unsigned int) * width,
                                        1, 1,
                                        0,
                                        relativeCoords,
                                        relativeCoords));

    
    vector<int> read_channel(channelCount);
    int channels_added=0;
    for (int i = 0; i < channelCount; i++)
    {
         if(randomChannels)
        {
	     read_channel[i] = random_int(2);
	     
        }
        if(!randomChannels || read_channel[i]==1)
        {
            PixelType type = IMF::NUM_PIXELTYPES;
            if (channelTypes[i] == 0)
                type = IMF::UINT;
            if (channelTypes[i] == 1)
                type = IMF::HALF;
            if (channelTypes[i] == 2)
                type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char *);

            frameBuffer.insert (str,
                                DeepSlice (type,
                                (char *) (&data[i][0][0] - memOffset),
                                pointerSize * 1,
                                pointerSize * width,
                                sampleSize,
                                1, 1,
                                0,
                                relativeCoords,
                                relativeCoords));
                channels_added++;
            }
    }
     if(channels_added==0)
    {
      cout << "skipping " <<flush;
      return;
    }
    for(int i = 0 ; i < fillChannels ; ++i )
    { 
        PixelType type  = IMF::FLOAT;
        int sampleSize = sizeof(float);            
        int pointerSize = sizeof (char *);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str();
        frameBuffer.insert (str,
                            DeepSlice (type,
                            (char *) (&data[i+channelCount][0][0] - memOffset),
                            pointerSize * 1,
                            pointerSize * width,
                            sampleSize,
                            1, 1,
                            0,
                            relativeCoords,
                            relativeCoords));
    }

    file.setFrameBuffer(frameBuffer);

    if (bulkRead)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels(); ly++)
        for (int lx = 0; lx < file.numXLevels(); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel(lx, ly);

            if (bulkRead)
            {
                //
                // Testing bulk read (without relative coordinates).
                //

                file.readPixelSampleCounts(0, file.numXTiles(lx) - 1, 0, file.numYTiles(ly) - 1, lx, ly);

                for (int i = 0; i < file.numYTiles(ly); i++)
                {
                    for (int j = 0; j < file.numXTiles(lx); j++)
                    {
                        Box2i box = file.dataWindowForTile(j, i, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy = y - dataWindowL.min.y;
                                int dwx = x - dataWindowL.min.x;
                                assert(localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]);

                                for (size_t k = 0; k < channelTypes.size(); k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] = new unsigned int[localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] = new half[localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                }
                                
                                for( int f = 0 ; f < fillChannels ; ++f )
                                {
                                     data[f + channelTypes.size()][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                }
                                
                            }
                            
                    }
                }

                file.readTiles(0, file.numXTiles(lx) - 1, 0, file.numYTiles(ly) - 1, lx, ly);
            }
            else if (bulkRead == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Testing per-tile read without relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles(ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles(lx); j++)
                        {
                            file.readPixelSampleCount(j, i, lx, ly);

                            Box2i box = file.dataWindowForTile(j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    assert(localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size(); k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int[localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] = new half[localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                    }
                                    for( int f = 0 ; f < fillChannels ; ++f )
                                    {
                                       data[f + channelTypes.size()][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                    }
                                }

                            file.readTile(j, i, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Testing per-tile read with relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles(ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles(lx); j++)
                        {
                            file.readPixelSampleCount(j, i, lx, ly);

                            Box2i box = file.dataWindowForTile(j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty = y - box.min.y;
                                    int tx = x - box.min.x;
                                    assert(localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size(); k++)
                                    {
                                          if( !randomChannels || read_channel[k]==1)
                                          {
                                                if (channelTypes[k] == 0)
                                                    data[k][ty][tx] = new unsigned int[localSampleCount[ty][tx]];
                                                if (channelTypes[k] == 1)
                                                    data[k][ty][tx] = new half[localSampleCount[ty][tx]];
                                                if (channelTypes[k] == 2)
                                                    data[k][ty][tx] = new float[localSampleCount[ty][tx]];
                                          }
                                            
                                         
                                    }
                                    for( int f = 0 ; f < fillChannels ; ++f )
                                    {
                                        data[f + channelTypes.size()][ty][tx] = new float[localSampleCount[ty][tx]];
                                    }
                                }

                            file.readTile(j, i, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty = y - box.min.y;
                                    int tx = x - box.min.x;

                                    for (size_t k = 0; k < channelTypes.size(); k++)
                                    {
                                         if( !randomChannels || read_channel[k]==1)
                                         {
                                                checkValue(data[k][ty][tx],
                                                        localSampleCount[ty][tx],
                                                        channelTypes[k],
                                                        dwx, dwy);
                                                if (channelTypes[k] == 0)
                                                    delete[] (unsigned int*) data[k][ty][tx];
                                                if (channelTypes[k] == 1)
                                                    delete[] (half*) data[k][ty][tx];
                                                if (channelTypes[k] == 2)
                                                    delete[] (float*) data[k][ty][tx];
                                         }
                                    }
                                    for( int f = 0 ; f < fillChannels ; ++f )
                                    {
                                         delete[] (float*) data[f+channelTypes.size()][ty][tx];
                                    }
                                }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight(ly); i++)
                    for (int j = 0; j < file.levelWidth(lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if( !randomChannels || read_channel[k]==1)
                            {
                                for (unsigned int l = 0; l < localSampleCount[i][j]; l++)
                                {
                                    if (channelTypes[k] == 0)
                                    {
                                        unsigned int* value = (unsigned int*)(data[k][i][j]);
                                        if (value[l] != static_cast<unsigned int>(i * width + j) % 2049)
                                            cout << j << ", " << i << " error, should be "
                                                << (i * width + j) % 2049 << ", is " << value[l]
                                                << endl << flush;
                                        assert (value[l] == static_cast<unsigned int>(i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 1)
                                    {
                                        half* value = (half*)(data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i << " error, should be "
                                                << (i * width + j) % 2049 << ", is " << value[l]
                                                << endl << flush;
                                        assert (((half*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 2)
                                    {
                                        float* value = (float*)(data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i << " error, should be "
                                                << (i * width + j) % 2049 << ", is " << value[l]
                                                << endl << flush;
                                        assert (((float*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                                    }
                                }
                            }
                        }

                for (int i = 0; i < file.levelHeight(ly); i++)
                    for (int j = 0; j < file.levelWidth(lx); j++)
                    {
                        for (int k = 0; k < channelCount; k++)
                        {
                                if (channelTypes[k] == 0)
                                    delete[] (unsigned int*) data[k][i][j];
                                if (channelTypes[k] == 1)
                                    delete[] (half*) data[k][i][j];
                                if (channelTypes[k] == 2)
                                    delete[] (float*) data[k][i][j];
                        }
                        for( int f = 0 ; f < fillChannels ; ++f )
                        {
                            delete[] (float*) data[f+channelTypes.size()][i][j];
                        }
                    }
            }
        }
}